

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeEnterCoPrhs4Col
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,int n)

{
  Status *pSVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  long in_RDI;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff78;
  int i_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff80;
  undefined4 local_5c [5];
  undefined4 *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  cpp_dec_float<200U,_int,_void> *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  cpp_dec_float<200U,_int,_void> *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined4 *local_8;
  
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::desc((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x238));
  pSVar1 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::Desc::colStatus((Desc *)in_stack_ffffffffffffff80,
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  i_00 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  switch(*pSVar1) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    pcVar3 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::maxObj(in_stack_ffffffffffffff80,i_00)->m_backend;
    local_30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_ffffffffffffff80,(int)((ulong)pcVar3 >> 0x20));
    local_38 = pcVar3;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff80,pcVar3);
    break;
  case P_FIXED:
  case P_ON_UPPER:
    pnVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::upper(in_stack_ffffffffffffff80,i_00);
    local_10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_ffffffffffffff80,
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_18 = pnVar2;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
              );
    break;
  default:
    local_5c[0] = 0;
    local_40 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_ffffffffffffff80,i_00);
    local_48 = local_5c;
    local_8 = local_48;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff80,
               (long_long_type)in_stack_ffffffffffffff78);
    break;
  case P_ON_LOWER:
    pcVar3 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower(in_stack_ffffffffffffff80,i_00)->m_backend;
    local_20 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)pcVar3,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_28 = pcVar3;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar3,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeEnterCoPrhs4Col(int i, int n)
{
   assert(this->baseId(i).isSPxColId());
   assert(this->number(SPxColId(this->baseId(i))) == n);

   switch(this->desc().colStatus(n))
   {
   // rowwise representation:
   case SPxBasisBase<R>::Desc::P_FIXED :
      assert(EQ(SPxLPBase<R>::upper(n), SPxLPBase<R>::lower(n), this->epsilon()));
      assert(SPxLPBase<R>::lower(n) > R(-infinity));

   //lint -fallthrough
   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      assert(rep() == ROW);
      assert(SPxLPBase<R>::upper(n) < R(infinity));
      (*theCoPrhs)[i] = SPxLPBase<R>::upper(n);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      assert(rep() == ROW);
      assert(SPxLPBase<R>::lower(n) > R(-infinity));
      (*theCoPrhs)[i] = SPxLPBase<R>::lower(n);
      break;

   // columnwise representation:
   case SPxBasisBase<R>::Desc::D_UNDEFINED :
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      assert(rep() == COLUMN);
      (*theCoPrhs)[i] = this->maxObj(n);
      break;

   default:             // variable left 0
      (*theCoPrhs)[i] = 0;
      break;
   }
}